

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O3

exr_result_t exr_print_context_info(exr_const_context_t ctxt,int verbose)

{
  undefined4 uVar1;
  long lVar2;
  undefined4 in_EAX;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  _internal_exr_context *pctxt;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  char cVar10;
  char cVar12;
  char cVar13;
  char cVar14;
  undefined1 auVar11 [16];
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if (verbose == 0) {
    printf("File \'%s\':\n");
  }
  else {
    uVar1 = *(undefined4 *)(ctxt + 2);
    cVar14 = (char)((uint)uVar1 >> 0x18);
    cVar13 = (char)((uint)uVar1 >> 0x10);
    cVar12 = (char)((uint)uVar1 >> 8);
    cVar10 = (char)uVar1;
    auVar11[0] = -(cVar10 == -1);
    auVar11[1] = -(cVar10 == -1);
    auVar11[2] = -(cVar10 == -1);
    auVar11[3] = -(cVar10 == -1);
    auVar11[4] = -(cVar12 == '\0');
    auVar11[5] = -(cVar12 == '\0');
    auVar11[6] = -(cVar12 == '\0');
    auVar11[7] = -(cVar12 == '\0');
    auVar11[8] = -(cVar13 == '\0');
    auVar11[9] = -(cVar13 == '\0');
    auVar11[10] = -(cVar13 == '\0');
    auVar11[0xb] = -(cVar13 == '\0');
    auVar11[0xc] = -(cVar14 == '\0');
    auVar11[0xd] = -(cVar14 == '\0');
    auVar11[0xe] = -(cVar14 == '\0');
    auVar11[0xf] = -(cVar14 == '\0');
    uVar3 = movmskps(in_EAX,auVar11);
    pcVar4 = " singletile";
    if ((uVar3 & 2) != 0) {
      pcVar4 = "";
    }
    pcVar6 = " shortnames";
    if ((uVar3 & 1) != 0) {
      pcVar6 = " longnames";
    }
    pcVar7 = " deep";
    if ((uVar3 & 4) != 0) {
      pcVar7 = "";
    }
    pcVar8 = " multipart";
    if ((uVar3 & 8) != 0) {
      pcVar8 = "";
    }
    printf("File \'%s\': ver %d flags%s%s%s%s\n",*(undefined8 *)(ctxt + 0x10),(ulong)(byte)ctxt[1],
           pcVar4,pcVar6,pcVar7,pcVar8);
    printf(" parts: %d\n");
  }
  if (0 < *(int *)(ctxt + 0xc4)) {
    lVar5 = 0;
    do {
      lVar2 = *(long *)(*(long *)(ctxt + 0x1d8) + lVar5 * 8);
      if (((verbose == 0) && (ctxt[5] == (_priv_exr_context_t)0x0)) &&
         (*(long *)(lVar2 + 0x68) == 0)) {
LAB_001290a2:
        if (*(long *)(lVar2 + 0x70) != 0) {
          printf("  ");
          print_attr(*(exr_attribute_t **)(lVar2 + 0x70),0);
        }
        printf("  ");
        print_attr(*(exr_attribute_t **)(lVar2 + 0x28),0);
        if (*(long *)(lVar2 + 0x60) != 0) {
          printf("\n  ");
          print_attr(*(exr_attribute_t **)(lVar2 + 0x60),0);
        }
        printf("\n  ");
        print_attr(*(exr_attribute_t **)(lVar2 + 0x38),0);
        printf("\n  ");
        print_attr(*(exr_attribute_t **)(lVar2 + 0x30),0);
        printf("\n  ");
        print_attr(*(exr_attribute_t **)(lVar2 + 0x20),0);
      }
      else {
        pcVar4 = "<single>";
        if (*(long *)(lVar2 + 0x68) != 0) {
          pcVar4 = *(char **)(*(long *)(*(long *)(lVar2 + 0x68) + 0x18) + 8);
        }
        printf(" part %d: %s\n",(ulong)((int)lVar5 + 1),pcVar4);
        if (verbose == 0) goto LAB_001290a2;
        if (0 < *(int *)(lVar2 + 8)) {
          lVar9 = 0;
          do {
            if (lVar9 != 0) {
              putchar(10);
            }
            printf("  ");
            print_attr(*(exr_attribute_t **)(*(long *)(lVar2 + 0x10) + lVar9 * 8),verbose);
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)(lVar2 + 8));
        }
      }
      putchar(10);
      if (*(long *)(lVar2 + 0x60) != 0) {
        printf("  tiled image has levels: x %d y %d\n",(ulong)*(uint *)(lVar2 + 0xc0),
               (ulong)*(uint *)(lVar2 + 0xc4));
        printf("    x tile count:");
        if (0 < *(int *)(lVar2 + 0xc0)) {
          lVar9 = 0;
          do {
            printf(" %d (sz %d)",(ulong)*(uint *)(*(long *)(lVar2 + 200) + lVar9 * 4),
                   (ulong)*(uint *)(*(long *)(lVar2 + 0xd8) + lVar9 * 4));
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)(lVar2 + 0xc0));
        }
        printf("\n    y tile count:");
        if (0 < *(int *)(lVar2 + 0xc4)) {
          lVar9 = 0;
          do {
            printf(" %d (sz %d)",(ulong)*(uint *)(*(long *)(lVar2 + 0xd0) + lVar9 * 4),
                   (ulong)*(uint *)(*(long *)(lVar2 + 0xe0) + lVar9 * 4));
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)(lVar2 + 0xc4));
        }
        putchar(10);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < *(int *)(ctxt + 0xc4));
  }
  return 0;
}

Assistant:

exr_result_t
exr_print_context_info (exr_const_context_t ctxt, int verbose)
{
    EXR_PROMOTE_CONST_CONTEXT_OR_ERROR (ctxt);
    if (verbose)
    {
        printf (
            "File '%s': ver %d flags%s%s%s%s\n",
            pctxt->filename.str,
            (int) pctxt->version,
            pctxt->is_singlepart_tiled ? " singletile" : "",
            pctxt->max_name_length == EXR_LONGNAME_MAXLEN ? " longnames"
                                                          : " shortnames",
            pctxt->has_nonimage_data ? " deep" : "",
            pctxt->is_multipart ? " multipart" : "");
        printf (" parts: %d\n", pctxt->num_parts);
    }
    else
    {
        printf ("File '%s':\n", pctxt->filename.str);
    }

    for (int partidx = 0; partidx < pctxt->num_parts; ++partidx)
    {
        const struct _internal_exr_part* curpart = pctxt->parts[partidx];
        if (verbose || pctxt->is_multipart || curpart->name)
            printf (
                " part %d: %s\n",
                partidx + 1,
                curpart->name ? curpart->name->string->str : "<single>");
        if (verbose)
        {
            for (int a = 0; a < curpart->attributes.num_attributes; ++a)
            {
                if (a > 0) printf ("\n");
                printf ("  ");
                print_attr (curpart->attributes.entries[a], verbose);
            }
            printf ("\n");
        }
        else
        {
            if (curpart->type)
            {
                printf ("  ");
                print_attr (curpart->type, verbose);
            }
            printf ("  ");
            print_attr (curpart->compression, verbose);
            if (curpart->tiles)
            {
                printf ("\n  ");
                print_attr (curpart->tiles, verbose);
            }
            printf ("\n  ");
            print_attr (curpart->displayWindow, verbose);
            printf ("\n  ");
            print_attr (curpart->dataWindow, verbose);
            printf ("\n  ");
            print_attr (curpart->channels, verbose);
            printf ("\n");
        }
        if (curpart->tiles)
        {
            printf (
                "  tiled image has levels: x %d y %d\n",
                curpart->num_tile_levels_x,
                curpart->num_tile_levels_y);
            printf ("    x tile count:");
            for (int l = 0; l < curpart->num_tile_levels_x; ++l)
                printf (
                    " %d (sz %d)",
                    curpart->tile_level_tile_count_x[l],
                    curpart->tile_level_tile_size_x[l]);
            printf ("\n    y tile count:");
            for (int l = 0; l < curpart->num_tile_levels_y; ++l)
                printf (
                    " %d (sz %d)",
                    curpart->tile_level_tile_count_y[l],
                    curpart->tile_level_tile_size_y[l]);
            printf ("\n");
        }
    }
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
}